

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

uint8_t __thiscall
libtorrent::aux::session_impl::use_quota_overhead
          (session_impl *this,peer_class_set *set,int amount_down,int amount_up)

{
  bool bVar1;
  int iVar2;
  peer_class_t c;
  peer_class *ch_00;
  bandwidth_channel *ch;
  peer_class *p;
  int i;
  int num;
  uint8_t ret;
  int amount_up_local;
  int amount_down_local;
  peer_class_set *set_local;
  session_impl *this_local;
  
  i._3_1_ = 0;
  iVar2 = peer_class_set::num_classes(set);
  for (p._4_4_ = 0; p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
    c = peer_class_set::class_at(set,p._4_4_);
    ch_00 = peer_class_pool::at(&this->m_classes,c);
    if (ch_00 != (peer_class *)0x0) {
      bVar1 = use_quota_overhead(this,(bandwidth_channel *)&ch_00->field_0x18,amount_down);
      if (bVar1) {
        i._3_1_ = i._3_1_ | 2;
      }
      bVar1 = use_quota_overhead(this,(bandwidth_channel *)ch_00,amount_up);
      if (bVar1) {
        i._3_1_ = i._3_1_ | 1;
      }
    }
  }
  return i._3_1_;
}

Assistant:

std::uint8_t session_impl::use_quota_overhead(peer_class_set& set, int const amount_down, int const amount_up)
	{
		std::uint8_t ret = 0;
		int const num = set.num_classes();
		for (int i = 0; i < num; ++i)
		{
			peer_class* p = m_classes.at(set.class_at(i));
			if (p == nullptr) continue;

			bandwidth_channel* ch = &p->channel[peer_connection::download_channel];
			if (use_quota_overhead(ch, amount_down))
				ret |= 1u << peer_connection::download_channel;
			ch = &p->channel[peer_connection::upload_channel];
			if (use_quota_overhead(ch, amount_up))
				ret |= 1u << peer_connection::upload_channel;
		}
		return ret;
	}